

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void sharestate_free(ssh_sharing_state *sharestate)

{
  ssh_sharing_connstate *cs_00;
  ssh_sharing_connstate *cs;
  ssh_sharing_state *sharestate_local;
  
  platform_ssh_share_cleanup(sharestate->sockname);
  while( true ) {
    cs_00 = (ssh_sharing_connstate *)delpos234(sharestate->connections,0);
    if (cs_00 == (ssh_sharing_connstate *)0x0) break;
    share_connstate_free(cs_00);
  }
  freetree234(sharestate->connections);
  if (sharestate->listensock != (Socket *)0x0) {
    sk_close(sharestate->listensock);
    sharestate->listensock = (Socket *)0x0;
  }
  safefree(sharestate->server_verstring);
  safefree(sharestate->sockname);
  safefree(sharestate);
  return;
}

Assistant:

void sharestate_free(ssh_sharing_state *sharestate)
{
    struct ssh_sharing_connstate *cs;

    platform_ssh_share_cleanup(sharestate->sockname);

    while ((cs = (struct ssh_sharing_connstate *)
            delpos234(sharestate->connections, 0)) != NULL) {
        share_connstate_free(cs);
    }
    freetree234(sharestate->connections);
    if (sharestate->listensock) {
        sk_close(sharestate->listensock);
        sharestate->listensock = NULL;
    }
    sfree(sharestate->server_verstring);
    sfree(sharestate->sockname);
    sfree(sharestate);
}